

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool el::base::utils::Str::wildCardMatch(char *str,char *pattern)

{
  bool bVar1;
  int iVar2;
  char *in_RSI;
  char *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  char *local_10;
  bool local_1;
  
  local_10 = in_RDI;
  while( true ) {
    if (*in_RSI == '\0') {
      local_1 = false;
      if (*local_10 == '\0') {
        local_1 = *in_RSI == '\0';
      }
      return local_1;
    }
    iVar2 = (int)*in_RSI;
    if (iVar2 == 0x2a) break;
    if (iVar2 == 0x3f) {
      if (*local_10 == '\0') {
        return false;
      }
    }
    else if (*local_10 != *in_RSI) {
      return false;
    }
    local_10 = local_10 + 1;
    in_RSI = in_RSI + 1;
  }
  bVar1 = wildCardMatch(in_RSI,(char *)CONCAT44(0x2a,in_stack_ffffffffffffffe0));
  if (bVar1) {
    return true;
  }
  if ((*local_10 != '\0') &&
     (bVar1 = wildCardMatch(in_RSI,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffe0)), bVar1)) {
    return true;
  }
  return false;
}

Assistant:

bool Str::wildCardMatch(const char* str, const char* pattern) {
  while (*pattern) {
    switch (*pattern) {
    case '?':
      if (!*str)
        return false;
      ++str;
      ++pattern;
      break;
    case '*':
      if (wildCardMatch(str, pattern + 1))
        return true;
      if (*str && wildCardMatch(str + 1, pattern))
        return true;
      return false;
    default:
      if (*str++ != *pattern++)
        return false;
      break;
    }
  }
  return !*str && !*pattern;
}